

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

bool GetLogCategory(LogFlags *flag,string_view str)

{
  int iVar1;
  const_iterator cVar2;
  bool bVar3;
  LogFlags LVar4;
  size_type __rlen;
  long in_FS_OFFSET;
  bool bVar5;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  long local_30;
  
  local_40._M_str = str._M_str;
  local_40._M_len = str._M_len;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = true;
  LVar4 = ALL;
  if (local_40._M_len != 0) {
    if (local_40._M_len == 3) {
      iVar1 = bcmp(local_40._M_str,"all",3);
joined_r0x0014ed1b:
      if (iVar1 == 0) goto LAB_0014ed42;
    }
    else if (local_40._M_len == 1) {
      iVar1 = bcmp(local_40._M_str,"1",1);
      goto joined_r0x0014ed1b;
    }
    cVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BCLog::LogFlags>,std::_Select1st<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>>
            ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BCLog::LogFlags>,std::_Select1st<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>>
                        *)&LOG_CATEGORIES_BY_STR_abi_cxx11_,&local_40);
    bVar5 = (_Rb_tree_header *)cVar2._M_node ==
            &LOG_CATEGORIES_BY_STR_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
    bVar3 = !bVar5;
    if (bVar5) goto LAB_0014ed45;
    LVar4 = *(LogFlags *)(cVar2._M_node + 2);
  }
LAB_0014ed42:
  *flag = LVar4;
LAB_0014ed45:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool GetLogCategory(BCLog::LogFlags& flag, std::string_view str)
{
    if (str.empty() || str == "1" || str == "all") {
        flag = BCLog::ALL;
        return true;
    }
    auto it = LOG_CATEGORIES_BY_STR.find(str);
    if (it != LOG_CATEGORIES_BY_STR.end()) {
        flag = it->second;
        return true;
    }
    return false;
}